

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcorolib.c
# Opt level: O3

int auxresume(lua_State *L,lua_State *co,int narg)

{
  int iVar1;
  uint uVar2;
  char *s;
  int nres;
  uint local_1c;
  
  iVar1 = lua_checkstack(co,narg);
  if (iVar1 == 0) {
    s = "too many arguments to resume";
  }
  else {
    lua_xmove(L,co,narg);
    uVar2 = lua_resume(co,L,narg,(int *)&local_1c);
    if (1 < uVar2) {
      lua_xmove(co,L,1);
      return -1;
    }
    iVar1 = lua_checkstack(L,local_1c + 1);
    if (iVar1 != 0) {
      lua_xmove(co,L,local_1c);
      return local_1c;
    }
    lua_settop(co,~local_1c);
    s = "too many results to resume";
  }
  lua_pushstring(L,s);
  return -1;
}

Assistant:

static int auxresume (lua_State *L, lua_State *co, int narg) {
  int status, nres;
  if (l_unlikely(!lua_checkstack(co, narg))) {
    lua_pushliteral(L, "too many arguments to resume");
    return -1;  /* error flag */
  }
  lua_xmove(L, co, narg);
  status = lua_resume(co, L, narg, &nres);
  if (l_likely(status == LUA_OK || status == LUA_YIELD)) {
    if (l_unlikely(!lua_checkstack(L, nres + 1))) {
      lua_pop(co, nres);  /* remove results anyway */
      lua_pushliteral(L, "too many results to resume");
      return -1;  /* error flag */
    }
    lua_xmove(co, L, nres);  /* move yielded values */
    return nres;
  }
  else {
    lua_xmove(co, L, 1);  /* move error message */
    return -1;  /* error flag */
  }
}